

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrEnumerateEnvironmentBlendModes
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,
                   uint32_t environmentBlendModeCapacityInput,
                   uint32_t *environmentBlendModeCountOutput,
                   XrEnvironmentBlendMode *environmentBlendModes)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_44;
  LoaderInstance *pLStack_40;
  XrResult result;
  LoaderInstance *loader_instance;
  XrEnvironmentBlendMode *environmentBlendModes_local;
  uint32_t *environmentBlendModeCountOutput_local;
  uint32_t environmentBlendModeCapacityInput_local;
  XrViewConfigurationType viewConfigurationType_local;
  XrSystemId systemId_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)environmentBlendModes;
  environmentBlendModes_local = environmentBlendModeCountOutput;
  environmentBlendModeCountOutput_local._0_4_ = environmentBlendModeCapacityInput;
  environmentBlendModeCountOutput_local._4_4_ = viewConfigurationType;
  _environmentBlendModeCapacityInput_local = systemId;
  systemId_local = (XrSystemId)instance;
  local_44 = ActiveLoaderInstance::Get(&stack0xffffffffffffffc0,"xrEnumerateEnvironmentBlendModes");
  if (XR_ERROR_VALIDATION_FAILURE < local_44) {
    this = LoaderInstance::DispatchTable(pLStack_40);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_44 = (*pXVar1->EnumerateEnvironmentBlendModes)
                         ((XrInstance)systemId_local,_environmentBlendModeCapacityInput_local,
                          environmentBlendModeCountOutput_local._4_4_,
                          (uint32_t)environmentBlendModeCountOutput_local,
                          environmentBlendModes_local,(XrEnvironmentBlendMode *)loader_instance);
  }
  return local_44;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEnumerateEnvironmentBlendModes(
    XrInstance                                  instance,
    XrSystemId                                  systemId,
    XrViewConfigurationType                     viewConfigurationType,
    uint32_t                                    environmentBlendModeCapacityInput,
    uint32_t*                                   environmentBlendModeCountOutput,
    XrEnvironmentBlendMode*                     environmentBlendModes) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEnumerateEnvironmentBlendModes");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EnumerateEnvironmentBlendModes(instance, systemId, viewConfigurationType, environmentBlendModeCapacityInput, environmentBlendModeCountOutput, environmentBlendModes);
    }
    return result;
}